

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.hpp
# Opt level: O0

bool __thiscall lan::db::iterate<int>(db *this,string *target,int value,db_bit_type type)

{
  db_bit *pdVar1;
  db_bits *pdVar2;
  invalid_argument *this_00;
  bool local_122;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78;
  string local_48;
  db_bit_type local_28;
  int local_24;
  db_bit_type type_local;
  int value_local;
  string *target_local;
  db *this_local;
  
  local_28 = type;
  local_24 = value;
  _type_local = target;
  target_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)target);
  pdVar2 = find_rec(this,&local_48,Container,Array,this->first);
  this->data = pdVar2;
  std::__cxx11::string::~string((string *)&local_48);
  if (pdVar2 == (db_bits *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(&local_e8,target,"{a}");
    error_string(&local_c8,this,_bit_name_error,&local_e8);
    std::invalid_argument::invalid_argument(this_00,(string *)&local_c8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_7a = 0;
  local_7b = 0;
  local_a2 = 0;
  local_a3 = 0;
  if (this->data->lin == (db_bit *)0x0) {
    pdVar1 = this->data;
    std::allocator<char>::allocator();
    local_a2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
    local_a3 = 1;
    local_122 = init_iter<int>(this,pdVar1,&local_a0,local_24,local_28);
  }
  else {
    pdVar1 = this->data;
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    local_7b = 1;
    local_122 = append_iter<int>(this,pdVar1,&local_78,local_24,local_28);
  }
  this_local._7_1_ = local_122;
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool iterate(std::string const target, any const value, db_bit_type const type){
            if((data = find_rec(target, lan::Container, lan::Array, first))) {
                return (data->lin) ? append_iter(data, "", value, type) :
                init_iter(data, "", value, type);
            } throw lan::errors::bit_name_error(error_string(errors::_private::_bit_name_error, target+"{a}"));
        }